

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ReporterRegistrar<Catch::CompactReporter>::ReporterRegistrar
          (ReporterRegistrar<Catch::CompactReporter> *this,string *name)

{
  IMutableRegistryHub *pIVar1;
  undefined8 in_RSI;
  shared_ptr<Catch::ReporterRegistrar<Catch::CompactReporter>::ReporterFactory>
  *in_stack_ffffffffffffff98;
  shared_ptr<Catch::IReporterFactory> *this_00;
  shared_ptr<Catch::IReporterFactory> local_30;
  undefined1 local_20 [16];
  undefined8 local_10;
  
  local_10 = in_RSI;
  pIVar1 = getMutableRegistryHub();
  this_00 = &local_30;
  clara::std::make_shared<Catch::ReporterRegistrar<Catch::CompactReporter>::ReporterFactory>();
  std::shared_ptr<Catch::IReporterFactory>::
  shared_ptr<Catch::ReporterRegistrar<Catch::CompactReporter>::ReporterFactory,void>
            (this_00,in_stack_ffffffffffffff98);
  (*pIVar1->_vptr_IMutableRegistryHub[2])(pIVar1,local_10,local_20);
  clara::std::shared_ptr<Catch::IReporterFactory>::~shared_ptr
            ((shared_ptr<Catch::IReporterFactory> *)0x1634d9);
  clara::std::shared_ptr<Catch::ReporterRegistrar<Catch::CompactReporter>::ReporterFactory>::
  ~shared_ptr((shared_ptr<Catch::ReporterRegistrar<Catch::CompactReporter>::ReporterFactory> *)
              0x1634e3);
  return;
}

Assistant:

explicit ReporterRegistrar( std::string const& name ) {
            getMutableRegistryHub().registerReporter( name, std::make_shared<ReporterFactory>() );
        }